

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recvfrom_op.hpp
# Opt level: O0

bool asio::detail::
     reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
     ::do_perform(reactor_op *base)

{
  bool bVar1;
  bool bVar2;
  basic_endpoint<asio::ip::udp> *this;
  long in_RDI;
  size_t new_size;
  size_t *in_stack_00000008;
  socket_addr_type *in_stack_00000010;
  int in_stack_0000001c;
  size_t in_stack_00000020;
  buf *in_stack_00000028;
  socket_type in_stack_00000030;
  bool result;
  size_t addr_len;
  buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1> bufs;
  reactive_socket_recvfrom_op_base<asio::mutable_buffers_1,_asio::ip::basic_endpoint<asio::ip::udp>_>
  *o;
  mutable_buffers_1 *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1> local_28;
  long local_10;
  
  local_10 = in_RDI;
  buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::buffer_sequence_adapter
            ((buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  asio::ip::basic_endpoint<asio::ip::udp>::capacity((basic_endpoint<asio::ip::udp> *)0x1985b4);
  buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::buffers(&local_28);
  buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::count(&local_28);
  asio::ip::basic_endpoint<asio::ip::udp>::data((basic_endpoint<asio::ip::udp> *)0x1985fd);
  new_size = local_10 + 0x18;
  this = (basic_endpoint<asio::ip::udp> *)(local_10 + 0x28);
  bVar1 = socket_ops::non_blocking_recvfrom
                    (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_0000001c,
                     in_stack_00000010,in_stack_00000008,(error_code *)bufs.buffer_.iov_base,
                     (size_t *)bufs.buffer_.iov_len);
  if (bVar1) {
    bVar2 = std::error_code::operator_cast_to_bool((error_code *)(local_10 + 0x18));
    if (!bVar2) {
      asio::ip::basic_endpoint<asio::ip::udp>::resize(this,new_size);
    }
  }
  return bVar1;
}

Assistant:

static bool do_perform(reactor_op* base)
  {
    reactive_socket_recvfrom_op_base* o(
        static_cast<reactive_socket_recvfrom_op_base*>(base));

    buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence> bufs(o->buffers_);

    std::size_t addr_len = o->sender_endpoint_.capacity();
    bool result = socket_ops::non_blocking_recvfrom(o->socket_,
        bufs.buffers(), bufs.count(), o->flags_,
        o->sender_endpoint_.data(), &addr_len,
        o->ec_, o->bytes_transferred_);

    if (result && !o->ec_)
      o->sender_endpoint_.resize(addr_len);

    ASIO_HANDLER_REACTOR_OPERATION((*o, "non_blocking_recvfrom",
          o->ec_, o->bytes_transferred_));

    return result;
  }